

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
::destroy_slots(raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                *this)

{
  bool bVar1;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  *this_local;
  
  bVar1 = is_soo(this);
  if (bVar1) {
    __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe46,
                  "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, std::allocator<const google::protobuf::Descriptor *>>::destroy_slots() [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, Alloc = std::allocator<const google::protobuf::Descriptor *>]"
                 );
  }
  return;
}

Assistant:

inline void destroy_slots() {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    if (PolicyTraits::template destroy_is_trivial<Alloc>()) return;
    IterateOverFullSlots(
        common(), slot_array(),
        [&](const ctrl_t*, slot_type* slot)
            ABSL_ATTRIBUTE_ALWAYS_INLINE { this->destroy(slot); });
  }